

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateValueSrc
               (ostringstream *src,UniformLayoutEntry *entry,void *basePtr,int elementNdx)

{
  UniformLayoutEntry *pUVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int iVar5;
  int local_d4;
  int local_bc;
  string local_b0;
  float *local_90;
  deUint8 *compPtr_1;
  int scalarNdx;
  string local_78;
  float *local_58;
  deUint8 *compPtr;
  int local_48;
  int rowNdx;
  int colNdx;
  int numCols;
  int numRows;
  int compSize;
  deUint8 *elemPtr;
  DataType DStack_28;
  bool isArray;
  int scalarSize;
  DataType scalarType;
  int elementNdx_local;
  void *basePtr_local;
  UniformLayoutEntry *entry_local;
  ostringstream *src_local;
  
  scalarSize = elementNdx;
  _scalarType = basePtr;
  basePtr_local = entry;
  entry_local = (UniformLayoutEntry *)src;
  DStack_28 = glu::getDataTypeScalarType(entry->type);
  elemPtr._4_4_ = glu::getDataTypeScalarSize(*(DataType *)((long)basePtr_local + 0x20));
  pUVar1 = entry_local;
  elemPtr._3_1_ = 1 < *(int *)((long)basePtr_local + 0x24);
  if ((bool)elemPtr._3_1_) {
    local_bc = scalarSize * *(int *)((long)basePtr_local + 0x30);
  }
  else {
    local_bc = 0;
  }
  _numRows = (long)_scalarType + (long)local_bc + (long)*(int *)((long)basePtr_local + 0x2c);
  numCols = 4;
  if (1 < elemPtr._4_4_) {
    pcVar3 = glu::getDataTypeName(*(DataType *)((long)basePtr_local + 0x20));
    poVar4 = std::operator<<((ostream *)pUVar1,pcVar3);
    std::operator<<(poVar4,"(");
  }
  bVar2 = glu::isDataTypeMatrix(*(DataType *)((long)basePtr_local + 0x20));
  if (bVar2) {
    colNdx = glu::getDataTypeMatrixNumRows(*(DataType *)((long)basePtr_local + 0x20));
    rowNdx = glu::getDataTypeMatrixNumColumns(*(DataType *)((long)basePtr_local + 0x20));
    iVar5 = extraout_EDX_00;
    for (local_48 = 0; local_48 < rowNdx; local_48 = local_48 + 1) {
      for (compPtr._4_4_ = 0; compPtr._4_4_ < colNdx; compPtr._4_4_ = compPtr._4_4_ + 1) {
        if ((*(byte *)((long)basePtr_local + 0x38) & 1) == 0) {
          local_d4 = local_48 * *(int *)((long)basePtr_local + 0x34) + compPtr._4_4_ * 4;
        }
        else {
          local_d4 = compPtr._4_4_ * *(int *)((long)basePtr_local + 0x34) + local_48 * 4;
        }
        local_58 = (float *)(_numRows + local_d4);
        if ((0 < local_48) || (0 < compPtr._4_4_)) {
          std::operator<<((ostream *)entry_local,", ");
          iVar5 = extraout_EDX_01;
        }
        pUVar1 = entry_local;
        de::floatToString_abi_cxx11_(&local_78,(de *)0x1,*local_58,iVar5);
        std::operator<<((ostream *)pUVar1,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        iVar5 = extraout_EDX_02;
      }
    }
  }
  else {
    iVar5 = extraout_EDX;
    for (compPtr_1._0_4_ = 0; (int)compPtr_1 < elemPtr._4_4_; compPtr_1._0_4_ = (int)compPtr_1 + 1)
    {
      local_90 = (float *)(_numRows + ((int)compPtr_1 << 2));
      if (0 < (int)compPtr_1) {
        std::operator<<((ostream *)entry_local,", ");
        iVar5 = extraout_EDX_03;
      }
      pUVar1 = entry_local;
      switch(DStack_28) {
      case TYPE_FLOAT:
        de::floatToString_abi_cxx11_(&local_b0,(de *)0x1,*local_90,iVar5);
        std::operator<<((ostream *)pUVar1,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        iVar5 = extraout_EDX_04;
        break;
      default:
        break;
      case TYPE_INT:
        std::ostream::operator<<(entry_local,(int)*local_90);
        iVar5 = extraout_EDX_05;
        break;
      case TYPE_UINT:
        poVar4 = (ostream *)std::ostream::operator<<(entry_local,(uint)*local_90);
        std::operator<<(poVar4,"u");
        iVar5 = extraout_EDX_06;
        break;
      case TYPE_BOOL:
        pcVar3 = "false";
        if (*local_90 != 0.0) {
          pcVar3 = "true";
        }
        std::operator<<((ostream *)entry_local,pcVar3);
        iVar5 = extraout_EDX_07;
      }
    }
  }
  if (1 < elemPtr._4_4_) {
    std::operator<<((ostream *)entry_local,")");
  }
  return;
}

Assistant:

void generateValueSrc (std::ostringstream& src, const UniformLayoutEntry& entry, const void* basePtr, int elementNdx)
{
	glu::DataType	scalarType		= glu::getDataTypeScalarType(entry.type);
	int				scalarSize		= glu::getDataTypeScalarSize(entry.type);
	bool			isArray			= entry.size > 1;
	const deUint8*	elemPtr			= (const deUint8*)basePtr + entry.offset + (isArray ? elementNdx * entry.arrayStride : 0);
	const int		compSize		= sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(entry.type) << "(";

	if (glu::isDataTypeMatrix(entry.type))
	{
		int	numRows	= glu::getDataTypeMatrixNumRows(entry.type);
		int	numCols	= glu::getDataTypeMatrixNumColumns(entry.type);

		DE_ASSERT(scalarType == glu::TYPE_FLOAT);

		// Constructed in column-wise order.
		for (int colNdx = 0; colNdx < numCols; colNdx++)
		{
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				const deUint8*	compPtr	= elemPtr + (entry.isRowMajor ? (rowNdx * entry.matrixStride + colNdx * compSize)
																	  : (colNdx * entry.matrixStride + rowNdx * compSize));

				if (colNdx > 0 || rowNdx > 0)
					src << ", ";

				src << de::floatToString(*((const float*)compPtr), 1);
			}
		}
	}
	else
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		{
			const deUint8* compPtr = elemPtr + scalarNdx * compSize;

			if (scalarNdx > 0)
				src << ", ";

			switch (scalarType)
			{
				case glu::TYPE_FLOAT:	src << de::floatToString(*((const float*)compPtr), 1);			break;
				case glu::TYPE_INT:		src << *((const int*)compPtr);									break;
				case glu::TYPE_UINT:	src << *((const deUint32*)compPtr) << "u";						break;
				case glu::TYPE_BOOL:	src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	if (scalarSize > 1)
		src << ")";
}